

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumprwtree.cpp
# Opt level: O0

void readchunk(StreamFile *s,ChunkHeaderInfo *h,int level)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  undefined1 local_3c [8];
  ChunkHeaderInfo nh;
  uint32 end;
  char *name;
  int i;
  int level_local;
  ChunkHeaderInfo *h_local;
  StreamFile *s_local;
  
  for (name._0_4_ = 0; (int)name < level; name._0_4_ = (int)name + 1) {
    printf("  ");
  }
  pcVar4 = getChunkName(h->type);
  uVar3 = h->length;
  unique0x100001dd = pcVar4;
  iVar1 = (*(s->super_Stream)._vptr_Stream[6])();
  uVar2 = (*(s->super_Stream)._vptr_Stream[6])();
  printf("%s (%x bytes @ 0x%x/0x%x) - [0x%x]\n",pcVar4,(ulong)uVar3,(ulong)(iVar1 - 0xc),
         (ulong)uVar2,(ulong)h->type);
  iVar1 = (*(s->super_Stream)._vptr_Stream[6])();
  nh.version = iVar1 + h->length;
  while( true ) {
    uVar3 = (*(s->super_Stream)._vptr_Stream[6])();
    if (nh.version <= uVar3) {
      return;
    }
    rw::readChunkHeaderInfo(&s->super_Stream,(ChunkHeaderInfo *)local_3c);
    if ((nh.type != h->version) || (nh.length != h->build)) break;
    readchunk(s,(ChunkHeaderInfo *)local_3c,level + 1);
    if (h->type == 0x510) {
      (*(s->super_Stream)._vptr_Stream[5])(s,(ulong)nh.version,0);
    }
  }
  (*(s->super_Stream)._vptr_Stream[5])(s,(ulong)(h->length - 0xc),1);
  return;
}

Assistant:

void
readchunk(StreamFile *s, ChunkHeaderInfo *h, int level)
{
	for(int i = 0; i < level; i++)
		printf("  ");
	const char *name = getChunkName(h->type);
	printf("%s (%x bytes @ 0x%x/0x%x) - [0x%x]\n",
		name, h->length, s->tell()-12, s->tell(), h->type);

	uint32 end = s->tell() + h->length;
	while(s->tell() < end){
		ChunkHeaderInfo nh;
		readChunkHeaderInfo(s, &nh);
		if(nh.version == h->version && nh.build == h->build){
			readchunk(s, &nh, level+1);
			if(h->type == 0x510)
				s->seek(end, 0);
		}else{
			s->seek(h->length-12);
			break;
		}
	}
}